

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReGlob.cpp
# Opt level: O3

regex * SudoMaker::ReGlob::Regexp
                  (regex *__return_storage_ptr__,string *glob,config config,bool _is_path)

{
  string regexp_str;
  string local_38;
  
  RegexpString(&local_38,glob,config,_is_path);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)__return_storage_ptr__,&local_38,
             config._0_4_ & 1 | 0x14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::regex ReGlob::Regexp(const std::string &glob, ReGlob::config config, bool _is_path) {
	auto regexp_str = RegexpString(glob, config, _is_path);

	std::regex_constants::syntax_option_type regex_type = std::regex::ECMAScript | std::regex::optimize;

	if (config.ignore_case) {
		regex_type = regex_type | std::regex::icase;
	}

	return std::regex(regexp_str, regex_type);
}